

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O3

void __thiscall
adios2::core::Attribute<std::complex<float>_>::~Attribute(Attribute<std::complex<float>_> *this)

{
  pointer pcVar1;
  pointer pcVar2;
  
  (this->super_AttributeBase)._vptr_AttributeBase = (_func_int **)&PTR__Attribute_00869b20;
  pcVar1 = (this->m_DataArray).
           super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
  }
  (this->super_AttributeBase)._vptr_AttributeBase = (_func_int **)&PTR__AttributeBase_00869cf8;
  pcVar2 = (this->super_AttributeBase).m_Name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_AttributeBase).m_Name.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

~Attribute() = default;